

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3f5684::QDynamicFileResourceRoot::~QDynamicFileResourceRoot
          (QDynamicFileResourceRoot *this)

{
  uchar *puVar1;
  
  (this->super_QDynamicBufferResourceRoot).super_QResourceRoot._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicFileResourceRoot_00661f98;
  if (this->unmapPointer == (uchar *)0x0) {
    puVar1 = (this->super_QDynamicBufferResourceRoot).buffer;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
  }
  else {
    munmap(this->unmapPointer,this->unmapLength);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->fileName).d);
  QDynamicBufferResourceRoot::~QDynamicBufferResourceRoot(&this->super_QDynamicBufferResourceRoot);
  return;
}

Assistant:

~QDynamicFileResourceRoot() {
        if (wasMemoryMapped())
            unmap_sys(unmapPointer, unmapLength);
        else
            delete[] mappingBuffer();
    }